

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalLeftDelimJoin::GetGlobalSinkState
          (PhysicalLeftDelimJoin *this,ClientContext *context)

{
  size_type sVar1;
  long *plVar2;
  long *plVar3;
  type state;
  ClientContext *in_RDX;
  long *local_28;
  _func_int **local_20;
  
  make_uniq<duckdb::LeftDelimJoinGlobalState,duckdb::ClientContext&,duckdb::PhysicalLeftDelimJoin_const&>
            ((duckdb *)&local_20,in_RDX,(PhysicalLeftDelimJoin *)context);
  (**(code **)(*(long *)(context->config).profiler_settings._M_h._M_bucket_count + 0x100))
            (&local_28);
  plVar3 = local_28;
  sVar1 = (context->config).profiler_settings._M_h._M_bucket_count;
  local_28 = (long *)0x0;
  plVar2 = *(long **)(sVar1 + 0x48);
  *(long **)(sVar1 + 0x48) = plVar3;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
  }
  if (8 < (context->config).profiler_settings._M_h._M_element_count -
          (long)(context->config).profiler_settings._M_h._M_before_begin._M_nxt) {
    state = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
            ::operator*((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                         *)((context->config).profiler_settings._M_h._M_bucket_count + 0x48));
    PhysicalHashAggregate::SetMultiScan(state);
  }
  (this->super_PhysicalDelimJoin).super_PhysicalOperator._vptr_PhysicalOperator = local_20;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalLeftDelimJoin::GetGlobalSinkState(ClientContext &context) const {
	auto state = make_uniq<LeftDelimJoinGlobalState>(context, *this);
	distinct.sink_state = distinct.GetGlobalSinkState(context);
	if (delim_scans.size() > 1) {
		PhysicalHashAggregate::SetMultiScan(*distinct.sink_state);
	}
	return std::move(state);
}